

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::checkTransformFeedbackBuffer
          (CaptureVertexSeparate *this,BindBufferCase bind_case,GLenum primitive_type)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 *puVar7;
  long lVar8;
  GLfloat result_1 [4];
  GLuint j_1;
  GLfloat *results_1;
  GLfloat reference;
  GLfloat result;
  GLuint k;
  GLuint j;
  GLfloat *results;
  GLint i;
  bool is_ok;
  GLuint number_of_vertices;
  Functions *gl;
  GLenum primitive_type_local;
  BindBufferCase bind_case_local;
  CaptureVertexSeparate *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext
                     (*(Context **)(&this->field_0x78 + (long)this->_vptr_CaptureVertexSeparate[-3])
                     );
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  switch(primitive_type) {
  case 0:
    i = 4;
    break;
  case 1:
    i = 4;
    break;
  case 2:
    i = 8;
    break;
  case 3:
    i = 6;
    break;
  case 4:
    i = 6;
    break;
  case 5:
    i = 6;
    break;
  case 6:
    i = 6;
    break;
  default:
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  bVar2 = true;
  for (results._4_4_ = 0; results._4_4_ < this->m_max_transform_feedback_separate_attribs + -1;
      results._4_4_ = results._4_4_ + 1) {
    (**(code **)(lVar6 + 0x40))(0x8c8e,this->m_buffers[results._4_4_]);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd0d);
    lVar8 = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glMapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd10);
    result = 0.0;
    while( true ) {
      bVar1 = false;
      if ((uint)result < (uint)i) {
        bVar1 = bVar2;
      }
      if (bVar1 == false) break;
      for (reference = 0.0; (uint)reference < 4; reference = (GLfloat)((int)reference + 1)) {
        if (0.125 < ABS(*(float *)(lVar8 + (ulong)(uint)((int)reference + (int)result * 4) * 4) -
                        (float)(uint)((int)reference + results._4_4_ * 4))) {
          bVar2 = false;
          break;
        }
      }
      result = (GLfloat)((int)result + 1);
    }
    (**(code **)(lVar6 + 0x1670))(0x8c8e);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glUnmapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd23);
  }
  if (bVar2 != false) {
    (**(code **)(lVar6 + 0x40))
              (0x8c8e,this->m_buffers[this->m_max_transform_feedback_separate_attribs + -1]);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd2a);
    lVar8 = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glMapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd2d);
    result_1[3] = 0.0;
    while( true ) {
      bVar1 = false;
      if ((uint)result_1[3] < (uint)i) {
        bVar1 = bVar2;
      }
      if (bVar1 == false) goto LAB_00e2e85e;
      if ((((0.125 < ABS((ABS(*(float *)(lVar8 + (ulong)(uint)((int)result_1[3] << 2) * 4)) - 1.0) +
                         0.0625)) ||
           (0.125 < ABS((ABS(*(float *)(lVar8 + (ulong)((int)result_1[3] * 4 + 1) * 4)) - 1.0) +
                        0.0625))) ||
          (0.125 < ABS(*(float *)(lVar8 + (ulong)((int)result_1[3] * 4 + 2) * 4)))) ||
         (0.125 < ABS(*(float *)(lVar8 + (ulong)((int)result_1[3] * 4 + 3) * 4) - 1.0))) break;
      result_1[3] = (GLfloat)((int)result_1[3] + 1);
    }
    bVar2 = false;
LAB_00e2e85e:
    (**(code **)(lVar6 + 0x1670))(0x8c8e);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glUnmapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd3e);
  }
  return bVar2;
}

Assistant:

bool gl3cts::TransformFeedback::CaptureVertexSeparate::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint number_of_vertices = 0;

	switch (primitive_type)
	{
	case GL_POINTS:
		number_of_vertices = 4;
		break;
	case GL_LINES:
		number_of_vertices = 4;
		break;
	case GL_LINE_LOOP:
		number_of_vertices = 8;
		break;
	case GL_LINE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLES:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_FAN:
		number_of_vertices = 6;
		break;
	default:
		throw 0;
	}

	bool is_ok = true;

	for (glw::GLint i = 0; i < m_max_transform_feedback_separate_attribs - 1; ++i)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffers[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

		for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
		{
			for (glw::GLuint k = 0; k < 4 /* vec4 */; ++k)
			{
				glw::GLfloat result	= results[j * 4 + k];
				glw::GLfloat reference = (glw::GLfloat)(i * 4 + k);

				if (fabs(result - reference) > 0.125 /* precision */)
				{
					is_ok = false;

					break;
				}
			}
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");
	}

	/* gl_Position */
	if (is_ok)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffers[m_max_transform_feedback_separate_attribs - 1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

		for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
		{
			glw::GLfloat result[4] = { results[j * 4], results[j * 4 + 1], results[j * 4 + 2], results[j * 4 + 3] };

			if ((fabs(fabs(result[0]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
				(fabs(fabs(result[1]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
				(fabs(result[2]) > 0.125 /* precision */) || (fabs(result[3] - 1.0) > 0.125 /* precision */))
			{
				is_ok = false;

				break;
			}
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");
	}

	return is_ok;
}